

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O0

bool __thiscall booster::aio::basic_socket::get_option(basic_socket *this,boolean_option_type opt)

{
  error_code eVar1;
  byte bVar2;
  bool bVar3;
  undefined8 uVar4;
  error_code *in_RDI;
  bool res;
  error_code e;
  system_error *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  int local_20;
  boolean_option_type in_stack_ffffffffffffffe4;
  basic_socket *in_stack_ffffffffffffffe8;
  
  std::error_code::error_code(in_RDI);
  bVar2 = get_option(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
                     (error_code *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  bVar3 = std::error_code::operator_cast_to_bool((error_code *)&local_20);
  if (!bVar3) {
    return (bool)(bVar2 & 1);
  }
  uVar4 = __cxa_allocate_exception(0x40);
  eVar1._4_4_ = in_stack_ffffffffffffffe4;
  eVar1._M_value = local_20;
  eVar1._M_cat = (error_category *)in_stack_ffffffffffffffe8;
  system::system_error::system_error(in_stack_ffffffffffffffc0,eVar1);
  __cxa_throw(uVar4,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

bool basic_socket::get_option(boolean_option_type opt)
{
	system::error_code e;
	bool res = get_option(opt,e);
	if(e) throw system::system_error(e);
	return res;
}